

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int line;
  uint *puVar4;
  char *pcVar5;
  char *in_RCX;
  int *address;
  ulong uVar6;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int sock_01;
  int family_01;
  int sock_02;
  int family_02;
  int family_03;
  int sock_03;
  int sock_04;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  FILE *__stream;
  bool bVar8;
  undefined8 uStack_c0;
  int opt;
  size_t sz;
  char any_address [128];
  
  uVar1 = get_test_port(argc,argv);
  test_addr_from(socket_address,"127.0.0.1",(char *)(ulong)uVar1,(int)in_RCX);
  uVar1 = get_test_port(argc,argv);
  iVar2 = 0x103112;
  test_addr_from(any_address,"*",(char *)(ulong)uVar1,(int)in_RCX);
  iVar2 = test_socket_impl((char *)0x5b,iVar2,family,(int)in_RCX);
  test_bind_impl((char *)0x5c,iVar2,(int)any_address,in_RCX);
  test_close_impl((char *)0x5d,iVar2,sock);
  iVar2 = test_socket_impl((char *)0x61,iVar2,family_00,(int)in_RCX);
  test_connect_impl((char *)0x62,iVar2,sock_00,in_RCX);
  iVar3 = (int)in_RCX;
  test_close_impl((char *)0x63,iVar2,sock_01);
  iVar2 = test_socket_impl((char *)0x66,iVar2,family_01,iVar3);
  sz = 4;
  address = &opt;
  iVar3 = nn_getsockopt(iVar2,0xfffffffffffffffc,1);
  __stream = _stderr;
  if (iVar3 != 0) {
    puVar4 = (uint *)__errno_location();
    pcVar5 = nn_err_strerror(*puVar4);
    uVar6 = (ulong)*puVar4;
    uStack_c0 = 0x6b;
    goto LAB_00102208;
  }
  if (sz == 4) {
    if (opt == 2) {
      iVar3 = nn_connect(iVar2,"ws://127.0.0.1");
      __stream = _stderr;
      if (iVar3 < 0) {
        puVar4 = (uint *)__errno_location();
        pcVar5 = nn_err_strerror(*puVar4);
        uVar6 = (ulong)*puVar4;
        uStack_c0 = 0x7a;
LAB_00102208:
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar5,uVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                ,uStack_c0);
        goto LAB_00102212;
      }
      iVar3 = nn_connect(iVar2,"ws://*:");
      if (iVar3 < 0) {
        iVar3 = nn_errno();
        __stream = _stderr;
        if (iVar3 != 0x16) {
          puVar4 = (uint *)__errno_location();
          pcVar5 = nn_err_strerror(*puVar4);
          uVar6 = (ulong)*puVar4;
          uStack_c0 = 0x7f;
          goto LAB_00102208;
        }
        iVar3 = nn_connect(iVar2,"ws://*:1000000");
        if (iVar3 < 0) {
          iVar3 = nn_errno();
          __stream = _stderr;
          if (iVar3 != 0x16) {
            puVar4 = (uint *)__errno_location();
            pcVar5 = nn_err_strerror(*puVar4);
            uVar6 = (ulong)*puVar4;
            uStack_c0 = 0x82;
            goto LAB_00102208;
          }
          iVar3 = nn_connect(iVar2,"ws://*:some_port");
          if (iVar3 < 0) {
            iVar3 = nn_connect(iVar2,"ws://eth10000;127.0.0.1:5555");
            if (iVar3 < 0) {
              iVar3 = nn_errno();
              __stream = _stderr;
              if (iVar3 == 0x13) {
                iVar3 = nn_bind(iVar2,"ws://127.0.0.1:");
                if (-1 < iVar3) {
                  pcVar5 = "rc < 0";
                  uStack_c0 = 0x8a;
                  goto LAB_001021c6;
                }
                iVar3 = nn_errno();
                __stream = _stderr;
                if (iVar3 == 0x16) {
                  iVar3 = nn_bind(iVar2,"ws://127.0.0.1:1000000");
                  if (-1 < iVar3) {
                    pcVar5 = "rc < 0";
                    uStack_c0 = 0x8d;
                    goto LAB_001021c6;
                  }
                  iVar3 = nn_errno();
                  __stream = _stderr;
                  if (iVar3 == 0x16) {
                    iVar3 = nn_bind(iVar2,"ws://eth10000:5555");
                    if (-1 < iVar3) {
                      pcVar5 = "rc < 0";
                      uStack_c0 = 0x90;
                      goto LAB_001021c6;
                    }
                    iVar3 = nn_errno();
                    __stream = _stderr;
                    if (iVar3 == 0x13) {
                      iVar3 = nn_connect(iVar2,"ws://:5555");
                      if (-1 < iVar3) {
                        pcVar5 = "rc < 0";
                        uStack_c0 = 0x94;
                        goto LAB_001021c6;
                      }
                      iVar3 = nn_errno();
                      __stream = _stderr;
                      if (iVar3 == 0x16) {
                        iVar3 = nn_connect(iVar2,"ws://-hostname:5555");
                        if (-1 < iVar3) {
                          pcVar5 = "rc < 0";
                          uStack_c0 = 0x97;
                          goto LAB_001021c6;
                        }
                        iVar3 = nn_errno();
                        __stream = _stderr;
                        if (iVar3 == 0x16) {
                          iVar3 = nn_connect(iVar2,"ws://abc.123.---.#:5555");
                          if (-1 < iVar3) {
                            pcVar5 = "rc < 0";
                            uStack_c0 = 0x9a;
                            goto LAB_001021c6;
                          }
                          iVar3 = nn_errno();
                          __stream = _stderr;
                          if (iVar3 == 0x16) {
                            iVar3 = nn_connect(iVar2,"ws://[::1]:5555");
                            if (-1 < iVar3) {
                              pcVar5 = "rc < 0";
                              uStack_c0 = 0x9d;
                              goto LAB_001021c6;
                            }
                            iVar3 = nn_errno();
                            __stream = _stderr;
                            if (iVar3 == 0x16) {
                              iVar3 = nn_connect(iVar2,"ws://abc.123.:5555");
                              if (-1 < iVar3) {
                                pcVar5 = "rc < 0";
                                uStack_c0 = 0xa0;
                                goto LAB_001021c6;
                              }
                              iVar3 = nn_errno();
                              __stream = _stderr;
                              if (iVar3 == 0x16) {
                                iVar3 = nn_connect(iVar2,"ws://abc...123:5555");
                                if (-1 < iVar3) {
                                  pcVar5 = "rc < 0";
                                  uStack_c0 = 0xa3;
                                  goto LAB_001021c6;
                                }
                                iVar3 = nn_errno();
                                __stream = _stderr;
                                if (iVar3 == 0x16) {
                                  iVar3 = nn_connect(iVar2,"ws://.123:5555");
                                  if (-1 < iVar3) {
                                    pcVar5 = "rc < 0";
                                    uStack_c0 = 0xa6;
                                    goto LAB_001021c6;
                                  }
                                  iVar3 = nn_errno();
                                  __stream = _stderr;
                                  if (iVar3 == 0x16) {
                                    test_close_impl((char *)0xa9,iVar2,sock_02);
                                    nn_sleep(200);
                                    iVar3 = test_socket_impl((char *)0xad,iVar2,family_02,
                                                             (int)address);
                                    iVar2 = iVar3;
                                    test_bind_impl((char *)0xae,iVar3,0x1050e0,(char *)address);
                                    line = test_socket_impl((char *)0xaf,iVar2,family_03,
                                                            (int)address);
                                    test_connect_impl((char *)0xb0,line,sock_03,(char *)address);
                                    nn_sleep(200);
                                    iVar2 = 100;
                                    uVar7 = extraout_RDX;
                                    while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
                                      test_send_impl((char *)0xb8,line,0x103274,(char *)address);
                                      test_recv_impl((char *)0xb9,iVar3,0x103274,(char *)address);
                                      test_send_impl((char *)0xbb,iVar3,0x103278,(char *)address);
                                      test_recv_impl((char *)0xbc,line,0x103278,(char *)address);
                                      uVar7 = extraout_RDX_00;
                                    }
                                    iVar2 = 100;
                                    while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
                                      test_send_impl((char *)0xc1,line,0x10327c,(char *)address);
                                      uVar7 = extraout_RDX_01;
                                    }
                                    iVar2 = 100;
                                    while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
                                      test_recv_impl((char *)0xc4,iVar3,0x10327c,(char *)address);
                                      uVar7 = extraout_RDX_02;
                                    }
                                    test_close_impl((char *)0xc7,line,(int)uVar7);
                                    test_close_impl((char *)0xc8,iVar3,sock_04);
                                    test_text();
                                    return 0;
                                  }
                                  puVar4 = (uint *)__errno_location();
                                  pcVar5 = nn_err_strerror(*puVar4);
                                  uVar6 = (ulong)*puVar4;
                                  uStack_c0 = 0xa7;
                                }
                                else {
                                  puVar4 = (uint *)__errno_location();
                                  pcVar5 = nn_err_strerror(*puVar4);
                                  uVar6 = (ulong)*puVar4;
                                  uStack_c0 = 0xa4;
                                }
                              }
                              else {
                                puVar4 = (uint *)__errno_location();
                                pcVar5 = nn_err_strerror(*puVar4);
                                uVar6 = (ulong)*puVar4;
                                uStack_c0 = 0xa1;
                              }
                            }
                            else {
                              puVar4 = (uint *)__errno_location();
                              pcVar5 = nn_err_strerror(*puVar4);
                              uVar6 = (ulong)*puVar4;
                              uStack_c0 = 0x9e;
                            }
                          }
                          else {
                            puVar4 = (uint *)__errno_location();
                            pcVar5 = nn_err_strerror(*puVar4);
                            uVar6 = (ulong)*puVar4;
                            uStack_c0 = 0x9b;
                          }
                        }
                        else {
                          puVar4 = (uint *)__errno_location();
                          pcVar5 = nn_err_strerror(*puVar4);
                          uVar6 = (ulong)*puVar4;
                          uStack_c0 = 0x98;
                        }
                      }
                      else {
                        puVar4 = (uint *)__errno_location();
                        pcVar5 = nn_err_strerror(*puVar4);
                        uVar6 = (ulong)*puVar4;
                        uStack_c0 = 0x95;
                      }
                    }
                    else {
                      puVar4 = (uint *)__errno_location();
                      pcVar5 = nn_err_strerror(*puVar4);
                      uVar6 = (ulong)*puVar4;
                      uStack_c0 = 0x91;
                    }
                  }
                  else {
                    puVar4 = (uint *)__errno_location();
                    pcVar5 = nn_err_strerror(*puVar4);
                    uVar6 = (ulong)*puVar4;
                    uStack_c0 = 0x8e;
                  }
                }
                else {
                  puVar4 = (uint *)__errno_location();
                  pcVar5 = nn_err_strerror(*puVar4);
                  uVar6 = (ulong)*puVar4;
                  uStack_c0 = 0x8b;
                }
              }
              else {
                puVar4 = (uint *)__errno_location();
                pcVar5 = nn_err_strerror(*puVar4);
                uVar6 = (ulong)*puVar4;
                uStack_c0 = 0x87;
              }
              goto LAB_00102208;
            }
            pcVar5 = "rc < 0";
            uStack_c0 = 0x86;
          }
          else {
            pcVar5 = "rc < 0";
            uStack_c0 = 0x84;
          }
        }
        else {
          pcVar5 = "rc < 0";
          uStack_c0 = 0x81;
        }
      }
      else {
        pcVar5 = "rc < 0";
        uStack_c0 = 0x7e;
      }
    }
    else {
      pcVar5 = "opt == NN_WS_MSG_TYPE_BINARY";
      uStack_c0 = 0x6d;
    }
  }
  else {
    pcVar5 = "sz == sizeof (opt)";
    uStack_c0 = 0x6c;
  }
LAB_001021c6:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
          uStack_c0);
LAB_00102212:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    int opt;
    size_t sz;
    int i;
    char any_address[128];

    test_addr_from(socket_address, "ws", "127.0.0.1",
            get_test_port(argc, argv));

    test_addr_from(any_address, "ws", "*",
            get_test_port(argc, argv));

    /*  Try closing bound but unconnected socket. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, any_address);
    test_close (sb);

    /*  Try closing a TCP socket while it not connected. At the same time
        test specifying the local address for the connection. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Check socket options. */
    sz = sizeof (opt);
    rc = nn_getsockopt (sc, NN_WS, NN_WS_MSG_TYPE, &opt, &sz);
    errno_assert (rc == 0);
    nn_assert (sz == sizeof (opt));
    nn_assert (opt == NN_WS_MSG_TYPE_BINARY);

#if 0
    //opt = 100;
    //sz = sizeof (opt);
    //rc = nn_getsockopt (sc, NN_WS, NN_WS_HANDSHAKE_TIMEOUT, &opt, &sz);
    //errno_assert (rc == 0);
    //nn_assert (sz == sizeof (opt));
    //nn_assert (opt == 100);
#endif

    /*  Default port 80 should be assumed if not explicitly declared. */
    rc = nn_connect (sc, "ws://127.0.0.1");
    errno_assert (rc >= 0);

    /*  Try using invalid address strings. */
    rc = nn_connect (sc, "ws://*:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://*:some_port");
    nn_assert (rc < 0);
    rc = nn_connect (sc, "ws://eth10000;127.0.0.1:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_bind (sc, "ws://127.0.0.1:");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://127.0.0.1:1000000");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_bind (sc, "ws://eth10000:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == ENODEV);

    rc = nn_connect (sc, "ws://:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://-hostname:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.---.#:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://[::1]:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc.123.:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://abc...123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);
    rc = nn_connect (sc, "ws://.123:5555");
    nn_assert (rc < 0);
    errno_assert (nn_errno () == EINVAL);

    test_close (sc);

    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address);

    /*  Leave enough time for connection establishment. */
    nn_sleep (200);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");

        test_send (sb, "DEF");
        test_recv (sc, "DEF");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "0123456789012345678901234567890123456789");
    }

    test_close (sc);
    test_close (sb);

    test_text ();

    return 0;
}